

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

void dpfb::args::getValue(char ***cursor,char **optArgsEnd,int *var)

{
  long lVar1;
  args *extraout_RAX;
  ulong uVar2;
  ulong extraout_RDX;
  args *this;
  ulong uVar3;
  args *paVar4;
  char **ppcVar5;
  bool bVar6;
  char *end;
  args *paStack_68;
  int *piStack_60;
  args *local_20;
  
  advanceToArg(cursor,optArgsEnd);
  lVar1 = strtol(**cursor,(char **)&local_20,10);
  *var = (int)lVar1;
  ppcVar5 = *cursor;
  paVar4 = (args *)*ppcVar5;
  if (paVar4 != local_20) {
    return;
  }
  getValue();
  this = (args *)*ppcVar5;
  if (paVar4 <= this) {
    __assert_fail("cursor < optArgsEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/args.cpp"
                  ,200,"void dpfb::args::advanceToArg(char **&, char **)");
  }
  *ppcVar5 = (char *)(this + 8);
  if (this + 8 != paVar4) {
    return;
  }
  advanceToArg(this);
  if (extraout_RDX == 0) {
    return;
  }
  uVar3 = 0;
  paStack_68 = extraout_RAX;
  piStack_60 = var;
  do {
    lVar1 = strtol((char *)this,(char **)&paStack_68,10);
    *(int *)(paVar4 + uVar3 * 4) = (int)lVar1;
    if (this == paStack_68) {
LAB_0010c36f:
      bVar6 = false;
    }
    else if (*paStack_68 == (args)0x0) {
      if (uVar3 == 0) {
        if (extraout_RDX != 1) {
          uVar2 = 1;
          do {
            *(undefined4 *)(paVar4 + uVar2 * 4) = *(undefined4 *)paVar4;
            uVar2 = uVar2 + 1;
          } while (extraout_RDX != uVar2);
        }
        goto LAB_0010c36f;
      }
      bVar6 = extraout_RDX - 1 <= uVar3;
    }
    else {
      if (*paStack_68 != (args)0x3a) goto LAB_0010c36f;
      bVar6 = false;
      if (uVar3 < extraout_RDX - 1) {
        this = paStack_68 + 1;
        bVar6 = true;
      }
    }
    if ((!bVar6) || (uVar3 = uVar3 + 1, uVar3 == extraout_RDX)) {
      return;
    }
  } while( true );
}

Assistant:

static void getValue(char**& cursor, char** optArgsEnd, int& var)
{
    advanceToArg(cursor, optArgsEnd);

    char* end;
    var = std::strtol(*cursor, &end, 10);
    if (*cursor == end) {
        std::fprintf(stderr, "Invalid %s: %s\n", *(cursor - 1), *cursor);
        std::exit(EXIT_FAILURE);
    }
}